

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O2

raw_ostream * __thiscall
llvm::raw_ostream::write_escaped(raw_ostream *this,StringRef Str,bool UseHexEscapes)

{
  raw_ostream *prVar1;
  raw_ostream *this_00;
  size_t sVar2;
  byte C;
  char C_00;
  uchar UC;
  byte bVar3;
  
  sVar2 = 0;
  do {
    if (Str.Length == sVar2) {
      return this;
    }
    bVar3 = Str.Data[sVar2];
    if (bVar3 == 9) {
      prVar1 = operator<<(this,'\\');
      C = 0x74;
LAB_00dbf9a6:
      operator<<(prVar1,C);
    }
    else {
      if (bVar3 == 10) {
        prVar1 = operator<<(this,'\\');
        C = 0x6e;
        goto LAB_00dbf9a6;
      }
      if (bVar3 == 0x22) {
        prVar1 = operator<<(this,'\\');
        C = 0x22;
        goto LAB_00dbf9a6;
      }
      if (bVar3 == 0x5c) {
        prVar1 = operator<<(this,'\\');
        C = 0x5c;
        goto LAB_00dbf9a6;
      }
      if (0x5e < (byte)(bVar3 - 0x20)) {
        this_00 = operator<<(this,'\\');
        prVar1 = this;
        if (UseHexEscapes) {
          operator<<(this_00,'x');
          C_00 = (bVar3 >> 4) + 0x37;
          if (bVar3 < 0xa0) {
            C_00 = (bVar3 >> 4) + 0x30;
          }
          operator<<(this,C_00);
          bVar3 = bVar3 & 0xf;
          C = bVar3 + 0x37;
          if (bVar3 < 10) {
            C = bVar3 + 0x30;
          }
        }
        else {
          operator<<(this,bVar3 >> 6 | 0x30);
          operator<<(this,bVar3 >> 3 & 7 | 0x30);
          C = bVar3 & 7 | 0x30;
        }
        goto LAB_00dbf9a6;
      }
      operator<<(this,bVar3);
    }
    sVar2 = sVar2 + 1;
  } while( true );
}

Assistant:

raw_ostream &raw_ostream::write_escaped(StringRef Str,
                                        bool UseHexEscapes) {
  for (unsigned char c : Str) {
    switch (c) {
    case '\\':
      *this << '\\' << '\\';
      break;
    case '\t':
      *this << '\\' << 't';
      break;
    case '\n':
      *this << '\\' << 'n';
      break;
    case '"':
      *this << '\\' << '"';
      break;
    default:
      if (isPrint(c)) {
        *this << c;
        break;
      }

      // Write out the escaped representation.
      if (UseHexEscapes) {
        *this << '\\' << 'x';
        *this << hexdigit((c >> 4 & 0xF));
        *this << hexdigit((c >> 0) & 0xF);
      } else {
        // Always use a full 3-character octal escape.
        *this << '\\';
        *this << char('0' + ((c >> 6) & 7));
        *this << char('0' + ((c >> 3) & 7));
        *this << char('0' + ((c >> 0) & 7));
      }
    }
  }

  return *this;
}